

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smooth_triangle.cpp
# Opt level: O0

Tuple4d * __thiscall
geometry::primitive::SmoothTriangle::local_normal
          (Tuple4d *__return_storage_ptr__,SmoothTriangle *this,Tuple4d *point,Intersection *hit)

{
  pair<double,_double> *ppVar1;
  Tuple4d local_b8;
  Tuple4d local_98;
  Tuple4d local_78;
  Tuple4d local_58;
  double local_38;
  double v;
  double u;
  Intersection *hit_local;
  Tuple4d *point_local;
  SmoothTriangle *this_local;
  
  u = (double)hit;
  hit_local = (Intersection *)point;
  point_local = (Tuple4d *)this;
  this_local = (SmoothTriangle *)__return_storage_ptr__;
  ppVar1 = core::Intersection::uv(hit);
  v = ppVar1->first;
  ppVar1 = core::Intersection::uv((Intersection *)u);
  local_38 = ppVar1->second;
  math::operator*(&local_78,(Tuple4d *)&this->field_0x180,v);
  math::operator*(&local_98,(Tuple4d *)&this->field_0x1a0,local_38);
  math::operator+(&local_58,&local_78,&local_98);
  math::operator*(&local_b8,(Tuple4d *)&this->field_0x160,(1.0 - v) - local_38);
  math::operator+(__return_storage_ptr__,&local_58,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::SmoothTriangle::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double u = hit.uv().first, v = hit.uv().second;
    return m_normals[1] * u + m_normals[2] * v + m_normals[0] * (1 - u - v);
}